

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O2

QLinuxFbDrmScreen * __thiscall
QLinuxFbDrmScreen::grabWindow(QLinuxFbDrmScreen *this,WId wid,int x,int y,int width,int height)

{
  QPixmap::QPixmap((QPixmap *)this);
  return this;
}

Assistant:

QPixmap QLinuxFbDrmScreen::grabWindow(WId wid, int x, int y, int width, int height) const
{
    Q_UNUSED(wid);
    Q_UNUSED(x);
    Q_UNUSED(y);
    Q_UNUSED(width);
    Q_UNUSED(height);

    return QPixmap();
}